

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdir-posix.c
# Opt level: O2

PDir * p_dir_new(pchar *path,PError **error)

{
  char *__s;
  PErrorIO code;
  pint native_code;
  DIR *__dirp;
  PDir *pPVar1;
  pchar *ppVar2;
  size_t sVar3;
  
  if (path == (pchar *)0x0) {
    pPVar1 = (PDir *)0x0;
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
  }
  else {
    __dirp = opendir(path);
    if (__dirp == (DIR *)0x0) {
      code = p_error_get_last_io();
      native_code = p_error_get_last_system();
      p_error_set_error_p(error,code,native_code,"Failed to call opendir() to open directory stream"
                         );
      pPVar1 = (PDir *)0x0;
    }
    else {
      pPVar1 = (PDir *)p_malloc0(0x20);
      if (pPVar1 == (PDir *)0x0) {
        pPVar1 = (PDir *)0x0;
        p_error_set_error_p(error,0x1f5,0,"Failed to allocate memory for directory structure");
        closedir(__dirp);
      }
      else {
        pPVar1->dir = (DIR *)__dirp;
        ppVar2 = p_strdup(path);
        pPVar1->path = ppVar2;
        ppVar2 = p_strdup(path);
        pPVar1->orig_path = ppVar2;
        __s = pPVar1->path;
        sVar3 = strlen(__s);
        if ((__s[sVar3 - 1] == '\\') || (__s[sVar3 - 1] == '/')) {
          __s[sVar3 - 1] = '\0';
        }
      }
    }
  }
  return pPVar1;
}

Assistant:

P_LIB_API PDir *
p_dir_new (const pchar	*path,
	   PError	**error)
{
	PDir	*ret;
	DIR	*dir;
	pchar	*pathp;

	if (P_UNLIKELY (path == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return NULL;
	}

	if (P_UNLIKELY ((dir = opendir (path)) == NULL)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to call opendir() to open directory stream");
		return NULL;
	}

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PDir))) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_NO_RESOURCES,
				     0,
				     "Failed to allocate memory for directory structure");
		closedir (dir);
		return NULL;
	}

	ret->dir       = dir;
	ret->path      = p_strdup (path);
	ret->orig_path = p_strdup (path);

	pathp = ret->path + strlen (ret->path) - 1;

	if (*pathp == '/' || *pathp == '\\')
		*pathp = '\0';

	return ret;
}